

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_copyWithin(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  byte bVar1;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue v;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BOOL BVar7;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  int *in_R8;
  JSValue JVar8;
  int shift;
  int count;
  int final;
  int from;
  int to;
  int len;
  JSObject *p;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  JSValueUnion JVar9;
  JSValue local_10;
  int64_t iStack_8;
  
  JVar8.u._4_4_ = in_stack_ffffffffffffffb4;
  JVar8.u.int32 = in_stack_ffffffffffffffb0;
  JVar8.tag._0_4_ = in_stack_ffffffffffffffb8;
  JVar8.tag._4_4_ = in_stack_ffffffffffffffbc;
  iVar3 = js_typed_array_get_length_internal
                    ((JSContext *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     JVar8);
  lVar2 = local_10._4_8_;
  if (iVar3 < 0) {
    local_10.u.ptr = (void *)(lVar2 << 0x20);
    iStack_8 = 6;
  }
  else {
    val.tag = (int64_t)in_RSI.ptr;
    val.u.ptr = in_RDI.ptr;
    iVar4 = JS_ToInt32Clamp((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8,val,
                            (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                            (int)in_stack_ffffffffffffffc0,iVar6);
    if (iVar4 == 0) {
      val_00.tag = (int64_t)in_RSI.ptr;
      val_00.u.ptr = in_RDI.ptr;
      iVar4 = JS_ToInt32Clamp((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8,val_00,
                              (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                              (int)in_stack_ffffffffffffffc0,iVar6);
      if (iVar4 == 0) {
        iVar4 = iVar3;
        if (((in_ECX < 3) || (iVar5 = JS_IsUndefined(*(JSValue *)(in_R8 + 8)), iVar5 != 0)) ||
           (val_01.tag = (int64_t)in_RSI.ptr, val_01.u.ptr = in_RDI.ptr,
           iVar6 = JS_ToInt32Clamp((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8,
                                   val_01,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                   (int)in_stack_ffffffffffffffc0,iVar6), iVar6 == 0)) {
          iVar3 = min_int(iVar3 - in_stack_ffffffffffffffb4,iVar4 - in_stack_ffffffffffffffb8);
          JVar9 = in_RSI;
          if (0 < iVar3) {
            BVar7 = typed_array_is_detached((JSContext *)in_RDI.ptr,(JSObject *)in_RSI.ptr);
            if (BVar7 != 0) {
              JVar8 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x1c1966);
              return JVar8;
            }
            bVar1 = ""[(int)(*(ushort *)((long)in_RSI.ptr + 6) - 0x15)];
            memmove((void *)(*(long *)((long)in_RSI.ptr + 0x38) +
                            (long)(in_stack_ffffffffffffffb8 << (bVar1 & 0x1f))),
                    (void *)(*(long *)((long)in_RSI.ptr + 0x38) +
                            (long)(in_stack_ffffffffffffffb4 << (bVar1 & 0x1f))),
                    (long)(iVar3 << (bVar1 & 0x1f)));
          }
          v.tag = in_RDX;
          v.u.ptr = JVar9.ptr;
          local_10 = JS_DupValue((JSContext *)in_RDI.ptr,v);
        }
        else {
          local_10.u.ptr = (void *)(lVar2 << 0x20);
          iStack_8 = 6;
        }
      }
      else {
        local_10.u.ptr = (void *)(lVar2 << 0x20);
        iStack_8 = 6;
      }
    }
    else {
      local_10.u.ptr = (void *)(lVar2 << 0x20);
      iStack_8 = 6;
    }
  }
  return local_10;
}

Assistant:

static JSValue js_typed_array_copyWithin(JSContext *ctx, JSValueConst this_val,
                                         int argc, JSValueConst *argv)
{
    JSObject *p;
    int len, to, from, final, count, shift;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        return JS_EXCEPTION;

    if (JS_ToInt32Clamp(ctx, &to, argv[0], 0, len, len))
        return JS_EXCEPTION;

    if (JS_ToInt32Clamp(ctx, &from, argv[1], 0, len, len))
        return JS_EXCEPTION;

    final = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[2], 0, len, len))
            return JS_EXCEPTION;
    }

    count = min_int(final - from, len - to);
    if (count > 0) {
        p = JS_VALUE_GET_OBJ(this_val);
        if (typed_array_is_detached(ctx, p))
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        shift = typed_array_size_log2(p->class_id);
        memmove(p->u.array.u.uint8_ptr + (to << shift),
                p->u.array.u.uint8_ptr + (from << shift),
                count << shift);
    }
    return JS_DupValue(ctx, this_val);
}